

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

char * read_opts(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *__s1;
  char *base;
  char *maybe_chipset;
  char *chip;
  char *pcStack_20;
  int c;
  char *filename;
  char **argv_local;
  int argc_local;
  
  pcStack_20 = (char *)0x0;
  if ((argc < 2) && (iVar1 = isatty(0), iVar1 != 0)) {
    usage();
  }
  pager_enabled = isatty(1);
  if (pager_enabled == 0) {
    colors = &envy_null_colors;
  }
  else {
    colors = &envy_def_colors;
  }
  do {
    iVar1 = getopt(argc,argv,"m:o:g:qac:l:i:r:he:d:p:s:x:");
    pcVar3 = _optarg;
    if (iVar1 == -1) {
      return pcStack_20;
    }
    switch(iVar1) {
    case 0x3f:
    case 0x68:
      usage();
      break;
    case 0x61:
      _filter_all_classes(0);
      break;
    case 99:
      if (*_optarg == '1') {
        colors = &envy_def_colors;
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-c accepts only 0 and 1\n");
          exit(1);
        }
        colors = &envy_null_colors;
      }
      break;
    case 100:
      handle_filter_opt(_optarg,0);
      break;
    case 0x65:
      handle_filter_opt(_optarg,1);
      break;
    case 0x67:
      if (*_optarg == '1') {
        _filter_gpu_addr(1);
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-g accepts only 0 and 1\n");
          exit(1);
        }
        _filter_gpu_addr(0);
      }
      break;
    case 0x69:
      if (*_optarg == '1') {
        indent_logs = 1;
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-i accepts only 0 and 1\n");
          exit(1);
        }
        indent_logs = 0;
      }
      break;
    case 0x6c:
      pcStack_20 = strdup(_optarg);
      pcVar3 = strdup(pcStack_20);
      __s1 = __xpg_basename(pcVar3);
      if ((chipset == 0) && (iVar1 = strncasecmp(__s1,"nv",2), iVar1 == 0)) {
        uVar2 = strtoul(__s1 + 2,(char **)0x0,0x10);
        chipset = (int)uVar2;
      }
      free(pcVar3);
      break;
    case 0x6d:
      maybe_chipset = _optarg;
      iVar1 = strncasecmp(_optarg,"NV",2);
      if (iVar1 == 0) {
        maybe_chipset = pcVar3 + 2;
      }
      uVar2 = strtoul(maybe_chipset,(char **)0x0,0x10);
      chipset = (int)uVar2;
      break;
    case 0x6f:
      if (*_optarg == '1') {
        _filter_ioctl_raw(1);
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-o accepts only 0 and 1\n");
          exit(1);
        }
        _filter_ioctl_raw(0);
      }
      break;
    case 0x70:
      if (*_optarg == '1') {
        _filter_pager_enabled(1);
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-p accepts only 0 and 1\n");
          exit(1);
        }
        _filter_pager_enabled(0);
      }
      break;
    case 0x71:
      handle_filter_opt("all",0);
      _filter_decode_pb(1);
      _filter_tsc(1);
      _filter_tic(1);
      _filter_cp(1);
      handle_filter_opt("shader",1);
      handle_filter_opt("macro",1);
      _filter_buffer_usage(1);
      _filter_all_classes(1);
      _filter_nvrm_describe_classes(1);
      break;
    case 0x72:
      if (*_optarg == '1') {
        _filter_macro_rt_verbose(1);
      }
      else {
        if (*_optarg != '0') {
          fprintf(_stderr,"-r accepts only 0 and 1\n");
          exit(1);
        }
        _filter_macro_rt_verbose(0);
      }
      break;
    case 0x73:
      mmt_sync_fd = open(_optarg,1);
      break;
    case 0x78:
      if ((*_optarg == '1') || (*_optarg == '2')) {
        fprintf(_stderr,"demmt needs libseccomp to enable sandboxing\n");
        exit(1);
      }
      if (*_optarg != '0') {
        fprintf(_stderr,"-x accepts only 0, 1 and 2\n");
        exit(1);
      }
      _filter_seccomp(0);
    }
  } while( true );
}

Assistant:

char *read_opts(int argc, char *argv[])
{
	char *filename = NULL;

	if (argc < 2 && isatty(0))
		usage();

	pager_enabled = isatty(1);
	if (pager_enabled)
		colors = &envy_def_colors;
	else
		colors = &envy_null_colors;

	int c;
	while ((c = getopt (argc, argv, "m:o:g:qac:l:i:r:he:d:p:s:x:")) != -1)
	{
		switch (c)
		{
			case 'm':
			{
				char *chip = optarg;
				if (strncasecmp(chip, "NV", 2) == 0)
					chip += 2;
				chipset = strtoul(chip, NULL, 16);
				break;
			}
			case 'o':
				if (optarg[0] == '1')
					_filter_ioctl_raw(1);
				else if (optarg[0] == '0')
					_filter_ioctl_raw(0);
				else
				{
					fprintf(stderr, "-o accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'g':
				if (optarg[0] == '1')
					_filter_gpu_addr(1);
				else if (optarg[0] == '0')
					_filter_gpu_addr(0);
				else
				{
					fprintf(stderr, "-g accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'q':
				handle_filter_opt("all", 0);
				_filter_decode_pb(1);
				_filter_tsc(1);
				_filter_tic(1);
				_filter_cp(1);
				handle_filter_opt("shader", 1);
				handle_filter_opt("macro", 1);
				_filter_buffer_usage(1);
				_filter_all_classes(1);
				_filter_nvrm_describe_classes(1);
				break;
			case 'a':
				_filter_all_classes(0);
				break;
			case 'c':
				if (optarg[0] == '1')
					colors = &envy_def_colors;
				else if (optarg[0] == '0')
					colors = &envy_null_colors;
				else
				{
					fprintf(stderr, "-c accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'l':
			{
				filename = strdup(optarg);
				char *maybe_chipset = strdup(filename);
				const char *base = basename(maybe_chipset);
				if (chipset == 0 && strncasecmp(base, "nv", 2) == 0)
					chipset = strtoul(base + 2, NULL, 16);
				free(maybe_chipset);
				break;
			}
			case 'i':
				if (optarg[0] == '1')
					indent_logs = 1;
				else if (optarg[0] == '0')
					indent_logs = 0;
				else
				{
					fprintf(stderr, "-i accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'r':
				if (optarg[0] == '1')
					_filter_macro_rt_verbose(1);
				else if (optarg[0] == '0')
					_filter_macro_rt_verbose(0);
				else
				{
					fprintf(stderr, "-r accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'p':
				if (optarg[0] == '1')
					_filter_pager_enabled(1);
				else if (optarg[0] == '0')
					_filter_pager_enabled(0);
				else
				{
					fprintf(stderr, "-p accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'x':
				if (optarg[0] == '1' || optarg[0] == '2')
				{
#ifdef LIBSECCOMP_AVAILABLE
					_filter_seccomp(optarg[0] - '1' + 1);
#else
					fprintf(stderr, "demmt needs libseccomp to enable sandboxing\n");
					exit(1);
#endif
				}
				else if (optarg[0] == '0')
					_filter_seccomp(0);
				else
				{
					fprintf(stderr, "-x accepts only 0, 1 and 2\n");
					exit(1);
				}
				break;
			case 'h':
			case '?':
				usage();
				break;
			case 'd':
				handle_filter_opt(optarg, 0);
				break;
			case 'e':
				handle_filter_opt(optarg, 1);
				break;
			case 's':
				mmt_sync_fd = open(optarg, O_WRONLY);
				break;
		}
	}

	return filename;
}